

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O3

void Bmc_PerformICheck(Gia_Man_t *p,int nFramesMax,int nTimeOut,int fEmpty,int fVerbose)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Cnf_Dat_t *pCnf;
  lit *begin;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Gia_Man_t *pGVar9;
  Gia_Man_t *p_00;
  Vec_Int_t *p_01;
  int *piVar10;
  void *__ptr;
  sat_solver *s;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  undefined4 in_register_00000034;
  ulong uVar15;
  timespec ts;
  uint local_ac;
  uint local_94;
  long local_70;
  timespec local_50;
  Gia_Man_t *local_40;
  size_t local_38;
  
  iVar6 = clock_gettime(3,&local_50);
  if (iVar6 < 0) {
    local_70 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_70 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (nFramesMax < 1) {
    __assert_fail("nFramesMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xce,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xcf,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  if (fVerbose != 0) {
    printf("Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops:\n",p->pName,
           (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
  }
  pGVar9 = Gia_ManDup(p);
  uVar15 = 0;
  p_00 = Gia_ManMiter(p,pGVar9,0,1,1,0,0);
  Gia_ManStop(pGVar9);
  if (p_00->vCos->nSize - p_00->nRegs != (p->vCos->nSize - p->nRegs) * 2) {
    __assert_fail("Gia_ManPoNum(pMiter) == 2 * Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xd9,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  if (p_00->nRegs != p->nRegs * 2) {
    __assert_fail("Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xda,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  piVar10 = (int *)0x0;
  pGVar9 = Jf_ManDeriveCnf(p_00,0);
  Gia_ManStop(p_00);
  pCnf = (Cnf_Dat_t *)pGVar9->pData;
  pGVar9->pData = (void *)0x0;
  iVar6 = p->vCos->nSize;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar14 = iVar6;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar14;
  if (iVar14 != 0) {
    piVar10 = (int *)malloc((long)iVar14 << 2);
  }
  p_01->pArray = piVar10;
  if (0 < p->nRegs) {
    if (1 < (uint)fEmpty) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    iVar14 = 0;
    iVar6 = fEmpty;
    do {
      Vec_IntPush(p_01,iVar6);
      iVar14 = iVar14 + 1;
      iVar6 = iVar6 + 2;
    } while (iVar14 < p->nRegs);
  }
  __ptr = (void *)0x0;
  uVar1 = p_01->nSize;
  local_ac = uVar1;
  if (fEmpty != 0) {
    local_ac = 0;
  }
  local_94 = 0x10;
  if (0xe < uVar1 - 1) {
    local_94 = uVar1;
  }
  if (local_94 != 0) {
    __ptr = malloc((long)(int)local_94 << 2);
  }
  __size = (long)(int)uVar1 * 4;
  local_38 = (ulong)uVar1 * 4;
  local_40 = pGVar9;
  do {
    s = Bmc_DeriveSolver(p,pGVar9,pCnf,nFramesMax,nTimeOut,(int)uVar15);
    begin = p_01->pArray;
    uVar15 = 0;
    iVar6 = sat_solver_solve(s,begin,begin + (int)uVar1,0,0,0,0);
    if (iVar6 != -1) {
      if (iVar6 == 1) {
        puts("The problem is satisfiable (the current set is not M-inductive).");
      }
      else {
        if (iVar6 != 0) {
          __assert_fail("status == l_False",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                        ,0xfe,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
        }
        printf("Timeout reached after %d seconds.\n",(ulong)(uint)nTimeOut);
      }
      break;
    }
    uVar8 = (s->conf_final).size;
    piVar10 = (s->conf_final).ptr;
    if ((int)local_94 < (int)uVar1) {
      if (__ptr == (void *)0x0) {
        __ptr = malloc(__size);
      }
      else {
        __ptr = realloc(__ptr,__size);
      }
      local_94 = uVar1;
      if (__ptr == (void *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
    }
    if ((int)uVar1 < 1) {
      if (0 < (int)uVar8) goto LAB_0059ea51;
      bVar5 = true;
    }
    else {
      memset(__ptr,0,local_38);
      if (0 < (int)uVar8) {
LAB_0059ea51:
        uVar11 = 0;
        do {
          uVar12 = piVar10[uVar11];
          if ((int)uVar12 < 0) goto LAB_0059ec86;
          uVar12 = uVar12 >> 1;
          if ((int)uVar1 <= (int)uVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)((long)__ptr + (ulong)uVar12 * 4) = 1;
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      uVar11 = 0;
      bVar5 = false;
      do {
        uVar8 = begin[uVar11];
        if ((int)uVar8 < 0) {
LAB_0059ec86:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (uVar11 != uVar8 >> 1) {
          __assert_fail("i == Abc_Lit2Var(Lit)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                        ,0x109,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
        }
        if (((uVar8 & 1) == 0) && (*(int *)((long)__ptr + uVar11 * 4) == 0)) {
          begin[uVar11] = uVar8 | 1;
          local_ac = local_ac - 1;
          bVar5 = true;
        }
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
      bVar5 = !bVar5;
    }
    if (fVerbose != 0) {
      iVar6 = pGVar9->vCos->nSize;
      iVar14 = pGVar9->vCis->nSize;
      iVar2 = pGVar9->nObjs;
      iVar3 = p->vCos->nSize;
      iVar4 = p->nRegs;
      iVar7 = sat_solver_nvars(s);
      uVar8 = sat_solver_nconflicts(s);
      uVar15 = (ulong)local_ac;
      printf("M =%4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
             ((double)(int)local_ac * 100.0) / (double)p->nRegs,
             CONCAT44(in_register_00000034,nFramesMax),
             (ulong)(uint)((~(iVar6 + iVar14) + iVar2) * (nFramesMax + 1)),
             (ulong)(uint)(iVar3 + iVar4 + iVar7),(ulong)uVar8);
      iVar14 = 3;
      iVar6 = clock_gettime(3,&local_50);
      if (iVar6 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      Abc_Print(iVar14,"%s =","Time");
      Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar13 + local_70) / 1000000.0);
      pGVar9 = local_40;
    }
    sat_solver_delete(s);
  } while ((bool)(fEmpty == 0 & (bVar5 ^ 1U)));
  Cnf_DataFree(pCnf);
  Gia_ManStop(pGVar9);
  if (begin != (lit *)0x0) {
    free(begin);
  }
  free(p_01);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Bmc_PerformICheck( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fEmpty, int fVerbose )
{
    int fUseOldCnf = 0;
    Gia_Man_t * pMiter, * pTemp;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vLits, * vUsed;
    int i, status, Lit;
    int nLitsUsed, nLits, * pLits;
    abctime clkStart = Abc_Clock();
    assert( nFramesMax > 0 );
    assert( Gia_ManRegNum(p) > 0 );

    if ( fVerbose )
    printf( "Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops:\n",
        Gia_ManName(p), Gia_ManAndNum(p), Gia_ManRegNum(p) );

    // create miter
    pTemp = Gia_ManDup( p );
    pMiter = Gia_ManMiter( p, pTemp, 0, 1, 1, 0, 0 );
    Gia_ManStop( pTemp );
    assert( Gia_ManPoNum(pMiter)  == 2 * Gia_ManPoNum(p) );
    assert( Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p) );
    // derive CNF
    if ( fUseOldCnf )
        pCnf = Cnf_DeriveGiaRemapped( pMiter );
    else
    {
        pMiter = Jf_ManDeriveCnf( pTemp = pMiter, 0 );
        Gia_ManStop( pTemp );
        pCnf = (Cnf_Dat_t *)pMiter->pData; pMiter->pData = NULL;
    }

    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, fEmpty) );

    // iteratively compute a minimal M-inductive set of next-state functions
    nLitsUsed = fEmpty ? 0 : Vec_IntSize(vLits);
    vUsed = Vec_IntAlloc( Vec_IntSize(vLits) );
    while ( 1 )
    {
        int fChanges = 0;
        // derive SAT solver        
        pSat = Bmc_DeriveSolver( p, pMiter, pCnf, nFramesMax, nTimeOut, fVerbose );
//        sat_solver_bookmark( pSat );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
        {
            printf( "Timeout reached after %d seconds.\n", nTimeOut );
            break;
        }
        if ( status == l_True )
        {
            printf( "The problem is satisfiable (the current set is not M-inductive).\n" );
            break;
        }
        assert( status == l_False );
        // call analize_final
        nLits = sat_solver_final( pSat, &pLits );
        // mark used literals
        Vec_IntFill( vUsed, Vec_IntSize(vLits), 0 );
        for ( i = 0; i < nLits; i++ )
            Vec_IntWriteEntry( vUsed, Abc_Lit2Var(pLits[i]), 1 );

        // check if there are any positive unused
        Vec_IntForEachEntry( vLits, Lit, i )
        {
            assert( i == Abc_Lit2Var(Lit) );
            if ( Abc_LitIsCompl(Lit) )
                continue;
            if ( Vec_IntEntry(vUsed, i) )
                continue;
            // positive literal became unused
            Vec_IntWriteEntry( vLits, i, Abc_LitNot(Lit) );
            nLitsUsed--;
            fChanges = 1;
        }
        // report the results
        if ( fVerbose )
        printf( "M =%4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
            nFramesMax, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
            Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
            sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
        if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
        // count the number of negative literals
        sat_solver_delete( pSat );
        if ( !fChanges || fEmpty )
            break;
//        break;
//        sat_solver_rollback( pSat );
    }
    Cnf_DataFree( pCnf );
    Gia_ManStop( pMiter );
    Vec_IntFree( vLits );
    Vec_IntFree( vUsed );
}